

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O2

int __thiscall ncnn::Layer_final::load_model(Layer_final *this,ModelBin *mb)

{
  int iVar1;
  
  iVar1 = (*this->layer_cpu->_vptr_Layer[3])();
  get_layer_properties(this);
  return iVar1;
}

Assistant:

virtual int load_model(const ModelBin& mb)
    {
#if NCNN_VULKAN
        if (layer_vulkan)
        {
            int ret = layer_vulkan->load_model(mb);
            get_layer_properties();
            return ret;
        }
#endif // NCNN_VULKAN

        int ret = layer_cpu->load_model(mb);
        get_layer_properties();
        return ret;
    }